

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  compareInfo *pInfo;
  int iVar2;
  u32 matchOther;
  uchar *zPattern;
  uchar *zString;
  uchar *zEsc;
  
  psVar1 = context->pOut->db;
  pInfo = (compareInfo *)context->pFunc->pUserData;
  zPattern = sqlite3_value_text(*argv);
  zString = sqlite3_value_text(argv[1]);
  iVar2 = sqlite3_value_bytes(*argv);
  if (psVar1->aLimit[8] < iVar2) {
    sqlite3_result_error(context,"LIKE or GLOB pattern too complex",-1);
    return;
  }
  if (argc == 3) {
    zEsc = sqlite3_value_text(argv[2]);
    if (zEsc == (uchar *)0x0) {
      return;
    }
    iVar2 = sqlite3Utf8CharLen((char *)zEsc,-1);
    if (iVar2 != 1) {
      sqlite3_result_error(context,"ESCAPE expression must be a single character",-1);
      return;
    }
    matchOther = sqlite3Utf8Read(&zEsc);
  }
  else {
    matchOther = (u32)pInfo->matchSet;
  }
  if (zPattern == (uchar *)0x0 || zString == (uchar *)0x0) {
    return;
  }
  iVar2 = patternCompare(zPattern,zString,pInfo,matchOther);
  sqlite3_result_int(context,(uint)(iVar2 == 0));
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  assert( zB==sqlite3_value_text(argv[0]) );  /* Encoding did not change */

  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context, 
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
  }else{
    escape = pInfo->matchSet;
  }
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context,
                      patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}